

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O2

void __thiscall C_matrix<double>::save(C_matrix<double> *this,string *fileName)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  uint uVar4;
  ofstream myfileX;
  
  std::ofstream::ofstream(&myfileX);
  std::ofstream::open((char *)&myfileX,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    for (uVar3 = 0; uVar3 = uVar3 & 0xffff, (int)uVar3 < this->m_L; uVar3 = uVar3 + 1) {
      uVar4 = 0;
      while( true ) {
        uVar4 = uVar4 & 0xffff;
        if (this->m_C <= (int)uVar4) break;
        poVar2 = std::ostream::_M_insert<double>(this->m_A[(int)(this->m_C * uVar3 + uVar4)]);
        std::operator<<(poVar2,"\t");
        uVar4 = uVar4 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&myfileX);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&myfileX);
  return;
}

Assistant:

void C_matrix<dataType>::save(std::string fileName)
{
    std::ofstream myfileX;
    myfileX.open (fileName.data(), std::ios::out );

    if(myfileX.is_open())
    {
        for(unsigned short i=0 ; i<m_L ; i++)
        {
            for(unsigned short j=0 ; j<m_C ; j++)
            {
                myfileX << m_A[getIndex(i,j)] << "\t";
            }
            myfileX << std::endl;
        }
        myfileX.close();
    }
}